

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Helpers.cpp
# Opt level: O2

void Helpers::TTReportLastIOErrorAsNeeded(BOOL ok,char *msg)

{
  uint uVar1;
  code *pcVar2;
  PAL_FILE *pPVar3;
  uint *puVar4;
  int *piVar5;
  char *pcVar6;
  
  if (ok != 0) {
    return;
  }
  pPVar3 = PAL_get_stderr(0);
  puVar4 = (uint *)PAL_errno(0);
  uVar1 = *puVar4;
  piVar5 = PAL_errno(0);
  pcVar6 = strerror(*piVar5);
  PAL_fprintf(pPVar3,"Error is: %i %s\n",(ulong)uVar1,pcVar6);
  pPVar3 = PAL_get_stderr(0);
  PAL_fprintf(pPVar3,"Message is: %s\n",msg);
  pPVar3 = PAL_get_stderr(0);
  PAL_fprintf(pPVar3,"ASSERTION (%s, line %d) %s %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/bin/ch/Helpers.cpp"
              ,0x20c,"false","IO Error!!!");
  pPVar3 = PAL_get_stderr(0);
  PAL_fflush(pPVar3);
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

void Helpers::TTReportLastIOErrorAsNeeded(BOOL ok, const char* msg)
{
    if(!ok)
    {
#ifdef _WIN32
        DWORD lastError = GetLastError();
        LPTSTR pTemp = NULL;
        FormatMessage(FORMAT_MESSAGE_ALLOCATE_BUFFER | FORMAT_MESSAGE_FROM_SYSTEM | FORMAT_MESSAGE_IGNORE_INSERTS, NULL, lastError, 0, (LPTSTR)&pTemp, 0, NULL);
        fwprintf(stderr, _u("Error is: %s\n"), pTemp);
        LocalFree(pTemp);
#else
        fprintf(stderr, "Error is: %i %s\n", errno, strerror(errno));
#endif
        fprintf(stderr, "Message is: %s\n", msg);

        AssertMsg(false, "IO Error!!!");
        exit(1);
    }
}